

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void dumpRecursive(int level,QObject *object)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ushort *puVar4;
  QObjectPrivate *pQVar5;
  char *pcVar6;
  const_iterator o;
  undefined8 *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  QObject *child;
  QObjectList *__range2;
  int indent;
  const_iterator __end2;
  const_iterator __begin2;
  QMetaObject *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QObject *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar7;
  const_iterator local_68;
  QString local_60;
  QMessageLogger local_48;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (undefined8 *)0x0) {
    uVar2 = in_EDI << 2;
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,(char *)in_stack_ffffffffffffff18
              );
    uVar7 = uVar2;
    (**(code **)*in_RSI)();
    pcVar3 = QMetaObject::className(in_stack_ffffffffffffff18);
    QObject::objectName(in_stack_ffffffffffffff58);
    QtPrivate::asString(&local_60);
    puVar4 = QString::utf16((QString *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                           );
    pQVar5 = QObjectPrivate::get((QObject *)0x3f81c8);
    (*(pQVar5->super_QObjectData)._vptr_QObjectData[2])(local_28);
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QMessageLogger::debug(&local_48,"%*s%s::%ls %s",(ulong)uVar2,"",pcVar3,puVar4,pcVar6);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QString::~QString((QString *)0x3f8244);
    QObject::children((QObject *)0x3f825d);
    local_68.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = QList<QObject_*>::begin
                         ((QList<QObject_*> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    o = QList<QObject_*>::end
                  ((QList<QObject_*> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                  );
    while (bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_68,o), bVar1) {
      QList<QObject_*>::const_iterator::operator*(&local_68);
      dumpRecursive((int)((ulong)in_RSI >> 0x20),
                    (QObject *)CONCAT44(uVar7,in_stack_ffffffffffffff70));
      QList<QObject_*>::const_iterator::operator++(&local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void dumpRecursive(int level, const QObject *object)
{
    if (object) {
        const int indent = level * 4;
        qDebug("%*s%s::%ls %s", indent, "", object->metaObject()->className(),
               qUtf16Printable(object->objectName()),
               QObjectPrivate::get(object)->flagsForDumping().c_str());
        for (auto child : object->children())
            dumpRecursive(level + 1, child);
    }
}